

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O2

void bfs(int u,vector<int,_std::allocator<int>_> *distance,vector<int,_std::allocator<int>_> *path)

{
  int iVar1;
  int *piVar2;
  pointer piVar3;
  int *piVar4;
  reference rVar5;
  int to;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_88;
  int local_84;
  _Deque_base<int,_std::allocator<int>_> local_80;
  
  local_84 = u;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_80);
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)&local_80,&local_84);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedbfs,
                     (long)local_84);
  *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
  (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [local_84] = -1;
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar1 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front((deque<int,_std::allocator<int>_> *)&local_80);
    piVar2 = edge.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar1].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    for (piVar4 = edge.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
      local_88 = *piVar4;
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedbfs,
                         (long)local_88);
      if ((*rVar5._M_p & rVar5._M_mask) == 0) {
        rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedbfs,
                           (long)local_88);
        *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)&local_80,&local_88);
        piVar3 = (distance->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3[local_88] = piVar3[iVar1] + 1;
        (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_88] = iVar1;
      }
    }
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_80);
  return;
}

Assistant:

void bfs(int u, vector<int> &distance, vector<int> &path) {
    queue<int> q;
    q.push(u);
    usedbfs[u] = true;
    path[u] = -1;
    while (!q.empty()) {
        int u = q.front();
        q.pop();
        for (int to : edge[u]) {
            if (!usedbfs[to]) {
                usedbfs[to] = true;
                q.push(to);
                distance[to] = distance[u] + 1;
                path[to] = u;
            }
        }
    }
}